

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O2

REF_STATUS ref_agents_dest(REF_AGENTS ref_agents,REF_INT id,REF_INT *dest)

{
  REF_AGENT_STRUCT *pRVar1;
  REF_INT RVar2;
  undefined8 in_R9;
  
  *dest = -1;
  pRVar1 = ref_agents->agent;
  switch(pRVar1[id].mode) {
  case REF_AGENT_UNUSED:
  case REF_AGENT_NEW:
  case REF_AGENT_MODE_LAST:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x107,
           "ref_agents_dest","has no dest",in_R9,0);
    return 1;
  case REF_AGENT_WALKING:
  case REF_AGENT_HOP_PART:
    RVar2 = pRVar1[id].part;
    break;
  case REF_AGENT_AT_BOUNDARY:
  case REF_AGENT_SUGGESTION:
  case REF_AGENT_ENCLOSING:
  case REF_AGENT_TERMINATED:
    RVar2 = pRVar1[id].home;
    break;
  default:
    return 0;
  }
  *dest = RVar2;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_agents_dest(REF_AGENTS ref_agents, REF_INT id,
                                          REF_INT *dest) {
  *dest = REF_EMPTY;
  switch (ref_agent_mode(ref_agents, id)) {
    case REF_AGENT_WALKING:
      *dest = ref_agent_part(ref_agents, id);
      break;
    case REF_AGENT_AT_BOUNDARY:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_HOP_PART:
      *dest = ref_agent_part(ref_agents, id);
      break;
    case REF_AGENT_SUGGESTION:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_ENCLOSING:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_TERMINATED:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_UNUSED:
    case REF_AGENT_NEW:
    case REF_AGENT_MODE_LAST:
      THROW("has no dest");
  }
  return REF_SUCCESS;
}